

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msbuild_objectmodel.cpp
# Opt level: O0

ssize_t __thiscall VCXProjectWriter::write(VCXProjectWriter *this,int __fd,void *__buf,size_t __n)

{
  VCConfiguration *config;
  XmlOutput *ch;
  XmlOutput *o;
  XmlOutput *this_00;
  undefined4 in_register_00000034;
  QString *name_00;
  long in_FS_OFFSET;
  char16_t *str;
  char16_t *str_1;
  QString name;
  QStringBuilder<QString,_QString_&> *in_stack_fffffffffffff218;
  QString *in_stack_fffffffffffff220;
  xml_output *this_01;
  QString *a;
  triState v;
  QArrayDataPointer<char16_t> *this_02;
  char *in_stack_fffffffffffff258;
  xml_output *in_stack_fffffffffffff268;
  XmlOutput *in_stack_fffffffffffff270;
  QArrayDataPointer<char16_t> local_528 [50];
  QArrayDataPointer<char16_t> local_78;
  QString local_60;
  xml_output local_48;
  long local_8;
  
  name_00 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.xo_value.d.size = -0x5555555555555556;
  local_48.xo_value.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_48.xo_value.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  this_02 = &local_78;
  QArrayDataPointer<char16_t>::QArrayDataPointer(this_02,(Data *)0x0,L"WinDeployQt_",0xc);
  a = &local_60;
  QString::QString(in_stack_fffffffffffff220,(DataPointer *)in_stack_fffffffffffff218);
  this_01 = &local_48;
  ::operator+(a,(QString *)this_01);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff218);
  QStringBuilder<QString,_QString_&>::~QStringBuilder
            ((QStringBuilder<QString,_QString_&> *)0x249619);
  QString::~QString((QString *)0x249623);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
  QString::QString(a,in_stack_fffffffffffff258);
  tag(name_00);
  XmlOutput::operator<<(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  QString::QString(a,in_stack_fffffffffffff258);
  attrTag(a,(QString *)this_01);
  config = (VCConfiguration *)
           XmlOutput::operator<<(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  QString::QString(a,in_stack_fffffffffffff258);
  generateCondition(config);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  QString::QString(a,in_stack_fffffffffffff258);
  QString::QString(a,in_stack_fffffffffffff258);
  attrTag(a,(QString *)this_01);
  ch = XmlOutput::operator<<(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  QString::QString(a,(char *)ch);
  tag(name_00);
  o = XmlOutput::operator<<(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  this_00 = XmlOutput::operator<<(in_stack_fffffffffffff270,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  tag(name_00);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  tag(name_00);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (local_528,(Data *)0x0,L"PopulateWinDeployQtItems_",0x19);
  QString::QString((QString *)this_01,(DataPointer *)in_stack_fffffffffffff218);
  ::operator+(a,(QString *)this_01);
  ::QStringBuilder::operator_cast_to_QString(in_stack_fffffffffffff218);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  generateCondition(config);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  tag(name_00);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  tag(name_00);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  tag(name_00);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  tag(name_00);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  QString::QString(a,(char *)ch);
  QString::QString(a,(char *)ch);
  attrTag(a,(QString *)this_01);
  v = (triState)((ulong)a >> 0x20);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  attrTagT((char *)this_02,v);
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  closetag();
  XmlOutput::operator<<(this_00,(xml_output *)o);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a18e);
  QString::~QString((QString *)0x24a19b);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a1b5);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a1cf);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a203);
  QString::~QString((QString *)0x24a210);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a22a);
  QString::~QString((QString *)0x24a237);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a251);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a26b);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a285);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a29f);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a2b9);
  QString::~QString((QString *)0x24a2c6);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a2e0);
  QString::~QString((QString *)0x24a2ed);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a307);
  QStringBuilder<QString,_QString_&>::~QStringBuilder
            ((QStringBuilder<QString,_QString_&> *)0x24a314);
  QString::~QString((QString *)0x24a321);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_01);
  QString::~QString((QString *)0x24a33b);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a355);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a389);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a3a3);
  XmlOutput::xml_output::~xml_output(this_01);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a3ca);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a3e4);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a3fe);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a418);
  QString::~QString((QString *)0x24a425);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a43f);
  QString::~QString((QString *)0x24a44c);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a466);
  XmlOutput::xml_output::~xml_output(this_01);
  QString::~QString((QString *)0x24a480);
  QString::~QString((QString *)0x24a48d);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void VCXProjectWriter::write(XmlOutput &xml, const VCWinDeployQtTool &tool)
{
    const QString name = QStringLiteral("WinDeployQt_") + tool.config->Name;
    xml << tag("Target")
           << attrTag(_Name, name)
           << attrTag("Condition", generateCondition(*tool.config))
           << attrTag("Inputs", "$(OutDir)\\$(TargetName).exe")
           << attrTag("Outputs", tool.Record)
           << tag(_Message)
              << attrTag("Text", tool.CommandLine)
           << closetag()
           << tag("Exec")
             << attrTag("Command", tool.CommandLine)
           << closetag()
        << closetag()
        << tag("Target")
           << attrTag(_Name, QStringLiteral("PopulateWinDeployQtItems_") + tool.config->Name)
           << attrTag("Condition", generateCondition(*tool.config))
           << attrTag("AfterTargets", "Link")
           << attrTag("DependsOnTargets", name)
           << tag("ReadLinesFromFile")
              << attrTag("File", tool.Record)
              << tag("Output")
                 << attrTag("TaskParameter", "Lines")
                 << attrTag("ItemName", "DeploymentItems")
              << closetag()
           << closetag()
           << tag(_ItemGroup)
              << tag("None")
                 << attrTag("Include", "@(DeploymentItems)")
                 << attrTagT("DeploymentContent", _True)
              << closetag()
           << closetag()
        << closetag();
}